

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

char nsvg__parseFillRule(char *str)

{
  int iVar1;
  char *str_local;
  
  iVar1 = strcmp(str,"nonzero");
  if (iVar1 == 0) {
    str_local._7_1_ = '\0';
  }
  else {
    iVar1 = strcmp(str,"evenodd");
    if (iVar1 == 0) {
      str_local._7_1_ = '\x01';
    }
    else {
      str_local._7_1_ = '\0';
    }
  }
  return str_local._7_1_;
}

Assistant:

static char nsvg__parseFillRule(const char* str)
{
	if (strcmp(str, "nonzero") == 0)
		return NSVG_FILLRULE_NONZERO;
	else if (strcmp(str, "evenodd") == 0)
		return NSVG_FILLRULE_EVENODD;
	// TODO: handle inherit.
	return NSVG_FILLRULE_NONZERO;
}